

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemTable.cpp
# Opt level: O0

bool __thiscall MemTable::put(MemTable *this,longlong k,string *v)

{
  NodePosi pred_node;
  string *key;
  size_t sVar1;
  Result RVar2;
  string local_68;
  time_t local_48;
  time_t timestamp;
  byte local_38;
  bool valid;
  string *local_28;
  string *v_local;
  longlong k_local;
  MemTable *this_local;
  
  local_28 = v;
  v_local = (string *)k;
  k_local = (longlong)this;
  timestamp = (time_t)std::__cxx11::
                      list<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>
                      ::begin(&this->qlist);
  RVar2 = skipSearch(this,(LevelIter)timestamp,(longlong)v_local);
  _valid = RVar2.node;
  local_38 = RVar2.valid;
  local_48 = time((time_t *)0x0);
  key = v_local;
  pred_node = _valid;
  if ((local_38 & 1) == 0) {
    std::__cxx11::string::string((string *)&local_68,(string *)v);
    _put(this,pred_node,(longlong)key,&local_68,false);
    std::__cxx11::string::~string((string *)&local_68);
  }
  if (((string *)(_valid->data).key == v_local) && (((_valid->data).delete_flag & 1U) == 0)) {
    sVar1 = size_of_node(_valid);
    this->_size_bytes = this->_size_bytes - sVar1;
    sVar1 = std::__cxx11::string::length();
    (_valid->data).value_length = sVar1;
    std::__cxx11::string::operator=((string *)&(_valid->data).value,(string *)v);
    (_valid->data).timestamp = local_48;
    sVar1 = size_of_node(_valid);
    this->_size_bytes = sVar1 + this->_size_bytes;
    this_local._7_1_ = true;
  }
  else if (((string *)(_valid->data).key == v_local) && (((_valid->data).delete_flag & 1U) != 0)) {
    sVar1 = size_of_node(_valid);
    this->_size_bytes = this->_size_bytes - sVar1;
    sVar1 = std::__cxx11::string::length();
    (_valid->data).value_length = sVar1;
    std::__cxx11::string::operator=((string *)&(_valid->data).value,(string *)v);
    (_valid->data).timestamp = local_48;
    sVar1 = size_of_node(_valid);
    this->_size_bytes = sVar1 + this->_size_bytes;
    do {
      (_valid->data).delete_flag = false;
      _valid = _valid->above;
    } while (_valid != (QuadListNode<SSTableDataEntry> *)0x0);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MemTable::put(long long k, std::string v) {
    auto[valid, node]=skipSearch(qlist.begin(), k);
    auto timestamp = time(nullptr);
    if (!valid) {
        // k don't exists. Insert new tower.
        _put(node, k, v, false);
    }
    if (node->data.key == k && !node->data.delete_flag) {
        _size_bytes -= size_of_node(node);
        node->data.value_length = v.length();
        node->data.value = std::move(v);
        node->data.timestamp = timestamp;
        _size_bytes += size_of_node(node);
        return true;
    }
    if (node->data.key == k && node->data.delete_flag) {
        // k found, but marked as deleted
        // update value, timestamp and reset delete_flag.
        _size_bytes -= size_of_node(node);
        node->data.value_length = v.length();
        node->data.value = std::move(v);
        node->data.timestamp = timestamp;
        _size_bytes += size_of_node(node);
        do {
            node->data.delete_flag = false;
            node = node->above;
        } while (node != nullptr);
        return true;
    }
    return false;
}